

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O0

void __thiscall DWaggleBase::DoWaggle(DWaggleBase *this,bool ceiling)

{
  sector_t_conflict *psVar1;
  uint uVar2;
  secplane_t *this_00;
  int iVar3;
  double dVar4;
  double dVar5;
  TVector2<double> local_40;
  double local_30;
  double dist;
  secplane_t *psStack_20;
  int pos;
  secplane_t *plane;
  DWaggleBase *pDStack_10;
  bool ceiling_local;
  DWaggleBase *this_local;
  
  if (!ceiling) {
    psStack_20 = &((this->super_DMover).super_DSectorEffect.m_Sector)->floorplane;
  }
  else {
    psStack_20 = &((this->super_DMover).super_DSectorEffect.m_Sector)->ceilingplane;
  }
  dist._4_4_ = (uint)ceiling;
  iVar3 = this->m_State;
  plane._7_1_ = ceiling;
  pDStack_10 = this;
  if (iVar3 == 1) {
    dVar5 = this->m_ScaleDelta + this->m_Scale;
    this->m_Scale = dVar5;
    if (this->m_TargetScale <= dVar5) {
      this->m_Scale = this->m_TargetScale;
      this->m_State = 2;
    }
  }
  else if (iVar3 == 2) {
    if ((this->m_Ticker != -1) && (iVar3 = this->m_Ticker + -1, this->m_Ticker = iVar3, iVar3 == 0))
    {
      this->m_State = 3;
    }
  }
  else if ((iVar3 == 3) &&
          (dVar5 = this->m_Scale - this->m_ScaleDelta, this->m_Scale = dVar5, dVar5 <= 0.0)) {
    dVar5 = this->m_OriginalDist;
    dVar4 = secplane_t::fD(psStack_20);
    local_30 = secplane_t::fC(psStack_20);
    uVar2 = dist._4_4_;
    local_30 = (dVar5 - dVar4) / local_30;
    psVar1 = (this->super_DMover).super_DSectorEffect.m_Sector;
    dVar5 = secplane_t::HeightDiff(psStack_20,this->m_OriginalDist);
    sector_t::ChangePlaneTexZ((sector_t *)psVar1,uVar2,-dVar5);
    secplane_t::setD(psStack_20,this->m_OriginalDist);
    P_ChangeSector((this->super_DMover).super_DSectorEffect.m_Sector,1,local_30,
                   (uint)(plane._7_1_ & 1),false);
    if ((plane._7_1_ & 1) == 0) {
      TObjPtr<DSectorEffect>::operator=
                (&((this->super_DMover).super_DSectorEffect.m_Sector)->floordata,
                 (DSectorEffect *)0x0);
    }
    else {
      TObjPtr<DSectorEffect>::operator=
                (&((this->super_DMover).super_DSectorEffect.m_Sector)->ceilingdata,
                 (DSectorEffect *)0x0);
    }
    (*(this->super_DMover).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject[4])();
    return;
  }
  this->m_Accumulator = this->m_AccDelta + this->m_Accumulator;
  local_30 = secplane_t::fD(psStack_20);
  this_00 = psStack_20;
  dVar5 = this->m_OriginalDist;
  TVector2<double>::TVector2(&local_40,0.0,0.0);
  dVar4 = BobSin(this->m_Accumulator);
  dVar4 = secplane_t::PointToDist(this_00,&local_40,dVar4 * this->m_Scale);
  secplane_t::setD(this_00,dVar5 + dVar4);
  uVar2 = dist._4_4_;
  psVar1 = (this->super_DMover).super_DSectorEffect.m_Sector;
  dVar5 = secplane_t::HeightDiff(psStack_20,local_30);
  sector_t::ChangePlaneTexZ((sector_t *)psVar1,uVar2,dVar5);
  local_30 = secplane_t::HeightDiff(psStack_20,local_30);
  P_Scroll3dMidtex((this->super_DMover).super_DSectorEffect.m_Sector,1,local_30,
                   (bool)(plane._7_1_ & 1));
  P_MoveLinkedSectors((this->super_DMover).super_DSectorEffect.m_Sector,1,local_30,
                      (bool)(plane._7_1_ & 1));
  P_ChangeSector((this->super_DMover).super_DSectorEffect.m_Sector,1,local_30,
                 (uint)(plane._7_1_ & 1),false);
  return;
}

Assistant:

void DWaggleBase::DoWaggle (bool ceiling)
{
	secplane_t *plane;
	int pos;
	double dist;

	if (ceiling)
	{
		plane = &m_Sector->ceilingplane;
		pos = sector_t::ceiling;
	}
	else
	{
		plane = &m_Sector->floorplane;
		pos = sector_t::floor;
	}

	switch (m_State)
	{
	case WGLSTATE_EXPAND:
		if ((m_Scale += m_ScaleDelta) >= m_TargetScale)
		{
			m_Scale = m_TargetScale;
			m_State = WGLSTATE_STABLE;
		}
		break;

	case WGLSTATE_REDUCE:
		if ((m_Scale -= m_ScaleDelta) <= 0)
		{ // Remove
			dist = (m_OriginalDist - plane->fD()) / plane->fC();
			m_Sector->ChangePlaneTexZ(pos, -plane->HeightDiff (m_OriginalDist));
			plane->setD(m_OriginalDist);
			P_ChangeSector (m_Sector, true, dist, ceiling, false);
			if (ceiling)
			{
				m_Sector->ceilingdata = NULL;
			}
			else
			{
				m_Sector->floordata = NULL;
			}
			Destroy ();
			return;
		}
		break;

	case WGLSTATE_STABLE:
		if (m_Ticker != -1)
		{
			if (!--m_Ticker)
			{
				m_State = WGLSTATE_REDUCE;
			}
		}
		break;
	}
	m_Accumulator += m_AccDelta;

	dist = plane->fD();
	plane->setD(m_OriginalDist + plane->PointToDist (DVector2(0, 0), BobSin(m_Accumulator) *m_Scale));
	m_Sector->ChangePlaneTexZ(pos, plane->HeightDiff (dist));
	dist = plane->HeightDiff (dist);

	// Interesting: Hexen passes 'true' for the crunch parameter which really is crushing damage here...
	// Also, this does not reset the move if it blocks.
	P_Scroll3dMidtex(m_Sector, 1, dist, ceiling);
	P_MoveLinkedSectors(m_Sector, 1, dist, ceiling);
	P_ChangeSector (m_Sector, 1, dist, ceiling, false);
}